

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_mul_comb_core(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *T,uchar T_size,
                     uchar *x,size_t d,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
                     mbedtls_ecp_restart_ctx *rs_ctx)

{
  size_t local_90;
  size_t i;
  mbedtls_ecp_point Txi;
  int ret;
  size_t d_local;
  uchar *x_local;
  uchar T_size_local;
  mbedtls_ecp_point *T_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  Txi.Z.p._4_4_ = 0xffffff92;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&i);
  Txi.Z.p._4_4_ = ecp_select_comb(grp,R,T,T_size,x[d]);
  if (((Txi.Z.p._4_4_ == 0) && (Txi.Z.p._4_4_ = mbedtls_mpi_lset(&R->Z,1), Txi.Z.p._4_4_ == 0)) &&
     ((local_90 = d, f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
      (Txi.Z.p._4_4_ = ecp_randomize_jac(grp,R,f_rng,p_rng), Txi.Z.p._4_4_ == 0)))) {
    while (local_90 != 0) {
      local_90 = local_90 - 1;
      Txi.Z.p._4_4_ = ecp_double_jac(grp,R,R);
      if (((Txi.Z.p._4_4_ != 0) ||
          (Txi.Z.p._4_4_ = ecp_select_comb(grp,(mbedtls_ecp_point *)&i,T,T_size,x[local_90]),
          Txi.Z.p._4_4_ != 0)) ||
         (Txi.Z.p._4_4_ = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)&i), Txi.Z.p._4_4_ != 0))
      break;
    }
  }
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&i);
  return Txi.Z.p._4_4_;
}

Assistant:

static int ecp_mul_comb_core( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                              const mbedtls_ecp_point T[], unsigned char T_size,
                              const unsigned char x[], size_t d,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng,
                              mbedtls_ecp_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point Txi;
    size_t i;

    mbedtls_ecp_point_init( &Txi );

#if !defined(MBEDTLS_ECP_RESTARTABLE)
    (void) rs_ctx;
#endif

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL && rs_ctx->rsm != NULL &&
        rs_ctx->rsm->state != ecp_rsm_comb_core )
    {
        rs_ctx->rsm->i = 0;
        rs_ctx->rsm->state = ecp_rsm_comb_core;
    }

    /* new 'if' instead of nested for the sake of the 'else' branch */
    if( rs_ctx != NULL && rs_ctx->rsm != NULL && rs_ctx->rsm->i != 0 )
    {
        /* restore current index (R already pointing to rs_ctx->rsm->R) */
        i = rs_ctx->rsm->i;
    }
    else
#endif
    {
        /* Start with a non-zero point and randomize its coordinates */
        i = d;
        MBEDTLS_MPI_CHK( ecp_select_comb( grp, R, T, T_size, x[i] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &R->Z, 1 ) );
        if( f_rng != 0 )
            MBEDTLS_MPI_CHK( ecp_randomize_jac( grp, R, f_rng, p_rng ) );
    }

    while( i != 0 )
    {
        MBEDTLS_ECP_BUDGET( MBEDTLS_ECP_OPS_DBL + MBEDTLS_ECP_OPS_ADD );
        --i;

        MBEDTLS_MPI_CHK( ecp_double_jac( grp, R, R ) );
        MBEDTLS_MPI_CHK( ecp_select_comb( grp, &Txi, T, T_size, x[i] ) );
        MBEDTLS_MPI_CHK( ecp_add_mixed( grp, R, R, &Txi ) );
    }

cleanup:

    mbedtls_ecp_point_free( &Txi );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL && rs_ctx->rsm != NULL &&
        ret == MBEDTLS_ERR_ECP_IN_PROGRESS )
    {
        rs_ctx->rsm->i = i;
        /* no need to save R, already pointing to rs_ctx->rsm->R */
    }
#endif

    return( ret );
}